

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_rect nk_shrink_rect(nk_rect r,float amount)

{
  nk_rect nVar1;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 uStack_28;
  float amount_local;
  nk_rect r_local;
  nk_rect res;
  
  r_local.x = r.w;
  if (amount * 2.0 <= r_local.x) {
    local_30 = r_local.x;
  }
  else {
    local_30 = amount * 2.0;
  }
  r_local.y = r.h;
  if (amount * 2.0 <= r_local.y) {
    local_34 = r_local.y;
  }
  else {
    local_34 = amount * 2.0;
  }
  uStack_28 = r.x;
  amount_local = r.y;
  nVar1.y = amount_local + amount;
  nVar1.x = uStack_28 + amount;
  nVar1.w = local_30 - (amount + amount);
  nVar1.h = local_34 - (amount + amount);
  return nVar1;
}

Assistant:

NK_INTERN struct nk_rect
nk_shrink_rect(struct nk_rect r, float amount)
{
    struct nk_rect res;
    r.w = NK_MAX(r.w, 2 * amount);
    r.h = NK_MAX(r.h, 2 * amount);
    res.x = r.x + amount;
    res.y = r.y + amount;
    res.w = r.w - 2 * amount;
    res.h = r.h - 2 * amount;
    return res;
}